

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMultiProcessHandler.cxx
# Opt level: O3

void __thiscall cmCTestMultiProcessHandler::StartNextTests(cmCTestMultiProcessHandler *this)

{
  uv_timer_ptr *puVar1;
  PropertiesMap *this_00;
  pointer pcVar2;
  cmCTest *pcVar3;
  unsigned_long uVar4;
  bool bVar5;
  uint uVar6;
  uv_timer_s *puVar7;
  ulong uVar8;
  mapped_type *ppcVar9;
  ostream *poVar10;
  ulong uVar11;
  uint64_t timeout;
  byte bVar12;
  ulong uVar13;
  undefined8 unaff_RBP;
  iterator __begin2;
  pointer __k;
  pointer piVar14;
  double dVar15;
  SystemInformation info;
  TestList copy;
  string testWithMinProcessors;
  ostringstream cmCTestLog_msg;
  long *local_248;
  long local_240;
  long local_238 [2];
  ulong local_228;
  uint local_21c;
  ulong local_218;
  ulong local_210;
  SystemInformation local_208;
  uint local_200;
  key_type local_1fc;
  ulong local_1f8;
  vector<int,_std::allocator<int>_> local_1f0;
  char *local_1d8;
  long local_1d0;
  char local_1c8;
  undefined7 uStack_1c7;
  uv_timer_ptr *local_1b8;
  cmCTestMultiProcessHandler *local_1b0;
  undefined1 local_1a8 [16];
  _func_int *local_198 [12];
  ios_base local_138 [264];
  
  puVar1 = &this->TestLoadRetryTimer;
  puVar7 = ::cm::uv_handle_ptr_base_<uv_timer_s>::get((uv_handle_ptr_base_<uv_timer_s> *)puVar1);
  if (puVar7 != (uv_timer_s *)0x0) {
    puVar7 = ::cm::uv_handle_ptr_::operator_cast_to_uv_timer_s_
                       (&puVar1->super_uv_handle_ptr_<uv_timer_s>);
    uv_timer_stop(puVar7);
  }
  if ((this->Tests).
      super_map<int,_cmCTestMultiProcessHandler::TestSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>_>
      ._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
    ::cm::uv_handle_ptr_base_<uv_timer_s>::reset((uv_handle_ptr_base_<uv_timer_s> *)puVar1);
    return;
  }
  bVar5 = CheckStopTimePassed(this);
  if (bVar5) {
    return;
  }
  local_210 = this->ParallelLevel;
  bVar5 = local_210 < this->RunningCount;
  uVar8 = local_210 - this->RunningCount;
  uVar13 = 0;
  if (!bVar5) {
    uVar13 = uVar8;
  }
  if (bVar5 || uVar8 == 0) {
    return;
  }
  if (this->SerialTestRunning != false) {
    return;
  }
  local_1d8 = &local_1c8;
  local_1d0 = 0;
  local_1c8 = '\0';
  local_1b8 = puVar1;
  cmsys::SystemInformation::SystemInformation(&local_208);
  uVar11 = this->TestLoad;
  if (uVar11 == 0) {
    local_218 = 0;
    local_1f8 = 0;
  }
  else {
    local_218 = this->FakeLoadForTesting;
    if (local_218 == 0) {
      dVar15 = cmsys::SystemInformation::GetLoadAverage(&local_208);
      dVar15 = ceil(dVar15);
      local_218 = (long)(dVar15 - 9.223372036854776e+18) & (long)dVar15 >> 0x3f | (long)dVar15;
      uVar8 = this->TestLoad;
    }
    else {
      this->FakeLoadForTesting = 1;
      uVar8 = uVar11;
    }
    local_1f8 = 0;
    if (local_218 <= uVar8) {
      local_1f8 = uVar8 - local_218;
    }
    uVar8 = uVar13;
    if (local_1f8 <= uVar13) {
      uVar8 = local_1f8;
    }
  }
  local_21c = (uint)CONCAT71((int7)((ulong)unaff_RBP >> 8),uVar11 != 0);
  std::vector<int,_std::allocator<int>_>::vector
            (&local_1f0,&(this->SortedTests).super_vector<int,_std::allocator<int>_>);
  piVar14 = local_1f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish;
  if (local_1f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start ==
      local_1f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    if (uVar11 == 0) goto LAB_001dd730;
  }
  else {
    this_00 = &this->Properties;
    __k = local_1f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start;
    local_1b0 = this;
    do {
      if (this->SerialTestRunning != false) break;
      ppcVar9 = std::
                map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                ::operator[](&this_00->
                              super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                             ,__k);
      if (((*ppcVar9)->RunSerial != true) || (uVar13 = uVar8, this->RunningCount == 0)) {
        local_1a8._0_4_ = *__k;
        ppcVar9 = std::
                  map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                  ::operator[](&this_00->
                                super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                               ,(key_type *)local_1a8);
        uVar13 = this->ParallelLevel;
        local_228 = (long)(*ppcVar9)->Processors;
        if (uVar13 < (ulong)(long)(*ppcVar9)->Processors) {
          local_228 = uVar13;
        }
        if (((this->HaveAffinity != 0) && (this->HaveAffinity < local_228)) &&
           (ppcVar9 = std::
                      map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                      ::operator[](&this_00->
                                    super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                                   ,(key_type *)local_1a8), (*ppcVar9)->WantAffinity != false)) {
          local_228 = this->HaveAffinity;
        }
        if (this->TestLoad == 0) {
LAB_001dd232:
          uVar11 = 0;
        }
        else {
          uVar11 = CONCAT71((int7)(uVar13 >> 8),1);
          if (local_228 <= local_1f8) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"OK to run ",10)
            ;
            local_1fc = *__k;
            ppcVar9 = std::
                      map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                      ::operator[](&this_00->
                                    super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                                   ,&local_1fc);
            local_248 = local_238;
            pcVar2 = ((*ppcVar9)->Name)._M_dataplus._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_248,pcVar2,pcVar2 + ((*ppcVar9)->Name)._M_string_length);
            poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1a8,(char *)local_248,local_240);
            std::__ostream_insert<char,std::char_traits<char>>(poVar10,", it requires ",0xe);
            poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar10," procs & system load is: ",0x19);
            poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
            std::ios::widen((char)poVar10->_vptr_basic_ostream[-3] + (char)poVar10);
            std::ostream::put((char)poVar10);
            std::ostream::flush();
            if (local_248 != local_238) {
              operator_delete(local_248,local_238[0] + 1);
            }
            pcVar3 = this->CTest;
            std::__cxx11::stringbuf::str();
            cmCTest::Log(pcVar3,0,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestMultiProcessHandler.cxx"
                         ,0x175,(char *)local_248,false);
            if (local_248 != local_238) {
              operator_delete(local_248,local_238[0] + 1);
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
            std::ios_base::~ios_base(local_138);
            local_21c = 0;
            goto LAB_001dd232;
          }
        }
        if (local_228 <= local_210) {
          local_200 = (uint)uVar11;
          local_248 = (long *)CONCAT44(local_248._4_4_,*__k);
          ppcVar9 = std::
                    map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                    ::operator[](&this_00->
                                  super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                                 ,(key_type *)&local_248);
          pcVar2 = ((*ppcVar9)->Name)._M_dataplus._M_p;
          local_1a8._0_8_ = local_198;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_1a8,pcVar2,pcVar2 + ((*ppcVar9)->Name)._M_string_length);
          std::__cxx11::string::operator=((string *)&local_1d8,(string *)local_1a8);
          if ((_func_int **)local_1a8._0_8_ != local_198) {
            operator_delete((void *)local_1a8._0_8_,(ulong)(local_198[0] + 1));
          }
          local_210 = local_228;
          uVar11 = (ulong)local_200;
          this = local_1b0;
        }
        uVar13 = uVar8 - local_228;
        if ((((char)uVar11 != '\0' || uVar8 < local_228) || (bVar5 = StartTest(this,*__k), !bVar5))
           && (uVar13 = uVar8, uVar8 == 0)) break;
      }
      __k = __k + 1;
      uVar8 = uVar13;
    } while (__k != piVar14);
    if ((local_21c & 1) == 0) goto LAB_001dd730;
  }
  if (local_1f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start ==
      local_1f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    bVar12 = 1;
  }
  else {
    bVar12 = 1;
    piVar14 = local_1f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      ppcVar9 = std::
                map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                ::operator[](&(this->Properties).
                              super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                             ,piVar14);
      bVar12 = bVar12 & (*ppcVar9)->RunSerial;
      piVar14 = piVar14 + 1;
    } while (piVar14 !=
             local_1f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_finish);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"***** WAITING, ",0xf);
  pcVar3 = this->CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar3,2,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestMultiProcessHandler.cxx"
               ,0x191,(char *)local_248,false);
  if (local_248 != local_238) {
    operator_delete(local_248,local_238[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  if (this->SerialTestRunning == true) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"Waiting for RUN_SERIAL test to finish.",0x26);
    pcVar3 = this->CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar3,2,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestMultiProcessHandler.cxx"
                 ,0x195,(char *)local_248,false);
  }
  else if (bVar12 == 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"System Load: ",0xd);
    poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,", Max Allowed Load: ",0x14);
    poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,", Smallest test ",0x10);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>(poVar10,local_1d8,local_1d0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," requires ",10);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
    pcVar3 = this->CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar3,2,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestMultiProcessHandler.cxx"
                 ,0x19f,(char *)local_248,false);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"Only RUN_SERIAL tests remain, awaiting available slot.",0x36);
    pcVar3 = this->CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar3,2,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestMultiProcessHandler.cxx"
                 ,0x198,(char *)local_248,false);
  }
  if (local_248 != local_238) {
    operator_delete(local_248,local_238[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"*****",5);
  std::ios::widen((char)(ostream *)local_1a8 + (char)*(_func_int **)(local_1a8._0_8_ + -0x18));
  std::ostream::put((char)local_1a8);
  std::ostream::flush();
  pcVar3 = this->CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar3,2,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestMultiProcessHandler.cxx"
               ,0x1a2,(char *)local_248,false);
  puVar1 = local_1b8;
  if (local_248 != local_238) {
    operator_delete(local_248,local_238[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  uVar6 = cmSystemTools::RandomSeed();
  uVar4 = this->FakeLoadForTesting;
  puVar7 = ::cm::uv_handle_ptr_base_<uv_timer_s>::get((uv_handle_ptr_base_<uv_timer_s> *)puVar1);
  if (puVar7 == (uv_timer_s *)0x0) {
    ::cm::uv_timer_ptr::init(puVar1,(EVP_PKEY_CTX *)&this->Loop);
  }
  timeout = 10;
  if (uVar4 == 0) {
    timeout = (ulong)((uVar6 % 5) * 1000 + 1000);
  }
  ::cm::uv_timer_ptr::start(puVar1,OnTestLoadRetryCB,timeout,0);
LAB_001dd730:
  if (local_1f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (key_type *)0x0) {
    operator_delete(local_1f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  cmsys::SystemInformation::~SystemInformation(&local_208);
  if (local_1d8 != &local_1c8) {
    operator_delete(local_1d8,CONCAT71(uStack_1c7,local_1c8) + 1);
  }
  return;
}

Assistant:

void cmCTestMultiProcessHandler::StartNextTests()
{
  if (this->TestLoadRetryTimer.get() != nullptr) {
    // This timer may be waiting to call StartNextTests again.
    // Since we have been called it is no longer needed.
    uv_timer_stop(this->TestLoadRetryTimer);
  }

  if (this->Tests.empty()) {
    this->TestLoadRetryTimer.reset();
    return;
  }

  if (this->CheckStopTimePassed()) {
    return;
  }

  size_t numToStart = 0;

  if (this->RunningCount < this->ParallelLevel) {
    numToStart = this->ParallelLevel - this->RunningCount;
  }

  if (numToStart == 0) {
    return;
  }

  // Don't start any new tests if one with the RUN_SERIAL property
  // is already running.
  if (this->SerialTestRunning) {
    return;
  }

  bool allTestsFailedTestLoadCheck = false;
  size_t minProcessorsRequired = this->ParallelLevel;
  std::string testWithMinProcessors;

  cmsys::SystemInformation info;

  unsigned long systemLoad = 0;
  size_t spareLoad = 0;
  if (this->TestLoad > 0) {
    // Activate possible wait.
    allTestsFailedTestLoadCheck = true;

    // Check for a fake load average value used in testing.
    if (this->FakeLoadForTesting > 0) {
      systemLoad = this->FakeLoadForTesting;
      // Drop the fake load for the next iteration to a value low enough
      // that the next iteration will start tests.
      this->FakeLoadForTesting = 1;
    }
    // If it's not set, look up the true load average.
    else {
      systemLoad = static_cast<unsigned long>(ceil(info.GetLoadAverage()));
    }
    spareLoad =
      (this->TestLoad > systemLoad ? this->TestLoad - systemLoad : 0);

    // Don't start more tests than the spare load can support.
    if (numToStart > spareLoad) {
      numToStart = spareLoad;
    }
  }

  TestList copy = this->SortedTests;
  for (auto const& test : copy) {
    // Take a nap if we're currently performing a RUN_SERIAL test.
    if (this->SerialTestRunning) {
      break;
    }
    // We can only start a RUN_SERIAL test if no other tests are also running.
    if (this->Properties[test]->RunSerial && this->RunningCount > 0) {
      continue;
    }

    size_t processors = GetProcessorsUsed(test);
    bool testLoadOk = true;
    if (this->TestLoad > 0) {
      if (processors <= spareLoad) {
        cmCTestLog(this->CTest, DEBUG,
                   "OK to run " << GetName(test) << ", it requires "
                                << processors << " procs & system load is: "
                                << systemLoad << std::endl);
        allTestsFailedTestLoadCheck = false;
      } else {
        testLoadOk = false;
      }
    }

    if (processors <= minProcessorsRequired) {
      minProcessorsRequired = processors;
      testWithMinProcessors = GetName(test);
    }

    if (testLoadOk && processors <= numToStart && this->StartTest(test)) {
      numToStart -= processors;
    } else if (numToStart == 0) {
      break;
    }
  }

  if (allTestsFailedTestLoadCheck) {
    // Find out whether there are any non RUN_SERIAL tests left, so that the
    // correct warning may be displayed.
    bool onlyRunSerialTestsLeft = true;
    for (auto const& test : copy) {
      if (!this->Properties[test]->RunSerial) {
        onlyRunSerialTestsLeft = false;
      }
    }
    cmCTestLog(this->CTest, HANDLER_OUTPUT, "***** WAITING, ");

    if (this->SerialTestRunning) {
      cmCTestLog(this->CTest, HANDLER_OUTPUT,
                 "Waiting for RUN_SERIAL test to finish.");
    } else if (onlyRunSerialTestsLeft) {
      cmCTestLog(this->CTest, HANDLER_OUTPUT,
                 "Only RUN_SERIAL tests remain, awaiting available slot.");
    } else {
      /* clang-format off */
      cmCTestLog(this->CTest, HANDLER_OUTPUT,
                 "System Load: " << systemLoad << ", "
                 "Max Allowed Load: " << this->TestLoad << ", "
                 "Smallest test " << testWithMinProcessors <<
                 " requires " << minProcessorsRequired);
      /* clang-format on */
    }
    cmCTestLog(this->CTest, HANDLER_OUTPUT, "*****" << std::endl);

    // Wait between 1 and 5 seconds before trying again.
    unsigned int milliseconds = (cmSystemTools::RandomSeed() % 5 + 1) * 1000;
    if (this->FakeLoadForTesting) {
      milliseconds = 10;
    }
    if (this->TestLoadRetryTimer.get() == nullptr) {
      this->TestLoadRetryTimer.init(this->Loop, this);
    }
    this->TestLoadRetryTimer.start(
      &cmCTestMultiProcessHandler::OnTestLoadRetryCB, milliseconds, 0);
  }
}